

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O3

void UA_MoniteredItem_SampleCallback(UA_Server *server,UA_MonitoredItem *monitoredItem)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  ushort uVar5;
  ushort uVar6;
  uint uVar7;
  uint uVar8;
  UA_Byte *pUVar9;
  long lVar10;
  MonitoredItem_queuedValue *pMVar11;
  MonitoredItem_queuedValue **ppMVar12;
  anon_struct_16_2_4dd83919_for_listEntry *paVar13;
  undefined1 auVar14 [8];
  UA_StatusCode UVar15;
  int iVar16;
  uint uVar17;
  size_t __size;
  MonitoredItem_queuedValue *__ptr;
  MonitoredItem_queuedValue *pMVar18;
  byte bVar19;
  byte bVar20;
  ulong uVar21;
  long lVar22;
  char *msg;
  UA_DataValue *pUVar23;
  UA_DataValue *pUVar24;
  UA_Logger logger;
  ulong uVar25;
  byte bVar26;
  byte bVar27;
  undefined1 auStack_348 [504];
  undefined8 uStack_150;
  UA_ReadValueId local_148;
  UA_DataValue local_f8;
  size_t sStack_90;
  UA_ByteString cbs;
  ulong local_78;
  ulong local_70;
  ulong local_68;
  ulong local_60;
  ulong local_58;
  ulong local_50;
  undefined1 auStack_48 [8];
  UA_ByteString valueEncoding;
  
  bVar27 = 0;
  if (monitoredItem->monitoredItemType != UA_MONITOREDITEMTYPE_CHANGENOTIFY) {
    return;
  }
  cbs.data = (UA_Byte *)monitoredItem->subscription;
  local_148.dataEncoding.name.length = 0;
  local_148.dataEncoding.name.data = (UA_Byte *)0x0;
  local_148.dataEncoding.namespaceIndex = 0;
  local_148.dataEncoding._2_6_ = 0;
  local_148.nodeId.namespaceIndex = (monitoredItem->monitoredNodeId).namespaceIndex;
  local_148.nodeId._2_2_ = *(undefined2 *)&(monitoredItem->monitoredNodeId).field_0x2;
  local_148.nodeId.identifierType = (monitoredItem->monitoredNodeId).identifierType;
  local_148.nodeId.identifier.string.length =
       (monitoredItem->monitoredNodeId).identifier.string.length;
  local_148.nodeId.identifier.string.data = (monitoredItem->monitoredNodeId).identifier.string.data;
  local_148._28_4_ = 0;
  local_148.attributeId = monitoredItem->attributeID;
  local_148.indexRange.length = (monitoredItem->indexRange).length;
  local_148.indexRange.data = (monitoredItem->indexRange).data;
  local_f8.serverTimestamp = 0;
  local_f8.serverPicoseconds = 0;
  local_f8._90_6_ = 0;
  local_f8.sourceTimestamp = 0;
  local_f8.sourcePicoseconds = 0;
  local_f8._74_6_ = 0;
  local_f8.value.arrayDimensions = (UA_UInt32 *)0x0;
  local_f8.status = 0;
  local_f8._60_4_ = 0;
  local_f8.value.data = (void *)0x0;
  local_f8.value.arrayDimensionsSize = 0;
  local_f8.value.storageType = UA_VARIANT_DATA;
  local_f8.value._12_4_ = 0;
  local_f8.value.arrayLength = 0;
  local_f8._0_8_ = 0;
  local_f8.value.type = (UA_DataType *)0x0;
  uStack_150 = 0x12392d;
  valueEncoding.data = (UA_Byte *)server;
  Service_Read_single(server,(UA_Session *)monitoredItem,monitoredItem->timestampsToReturn,
                      &local_148,&local_f8);
  auStack_48 = (undefined1  [8])0x200;
  bVar19 = local_f8._0_1_;
  bVar26 = bVar19 & 0xfe;
  if (monitoredItem->trigger != UA_DATACHANGETRIGGER_STATUS) {
    bVar26 = bVar19;
  }
  bVar20 = 0xd7;
  if (monitoredItem->trigger < UA_DATACHANGETRIGGER_STATUSVALUETIMESTAMP) {
    bVar20 = 0xc3;
  }
  local_f8._0_1_ = bVar20 & bVar26;
  valueEncoding.length = (size_t)auStack_348;
  __size = UA_calcSizeBinary(&local_f8,UA_TYPES + 0x16);
  if (__size == 0) {
LAB_001239b0:
    bVar1 = 0;
    bVar20 = 0;
  }
  else {
    auVar14 = auStack_48;
    if (0x200 < __size) {
      auStack_48 = (undefined1  [8])0x0;
      valueEncoding.length = (size_t)malloc(__size);
      auVar14 = (undefined1  [8])__size;
      if ((void *)valueEncoding.length == (void *)0x0) goto LAB_001239b0;
    }
    auStack_48 = auVar14;
    end = (UA_Byte *)((long)auStack_48 + valueEncoding.length);
    encodeBuf = (UA_ByteString *)auStack_48;
    bVar1 = 0;
    exchangeBufferCallback = (UA_exchangeEncodeBuffer)0x0;
    exchangeBufferCallbackHandle = (void *)0x0;
    pos = (UA_Byte *)valueEncoding.length;
    UVar15 = UA_encodeBinaryInternal(&local_f8,UA_TYPES + 0x16);
    bVar20 = 0;
    if (UVar15 == 0) {
      auStack_48 = (undefined1  [8])((long)pos - valueEncoding.length);
      pUVar9 = (monitoredItem->lastSampledValue).data;
      if (((pUVar9 == (UA_Byte *)0x0) ||
          (auStack_48 != (undefined1  [8])(monitoredItem->lastSampledValue).length)) ||
         (iVar16 = bcmp((void *)valueEncoding.length,pUVar9,(size_t)auStack_48), iVar16 != 0)) {
        bVar1 = 1;
        bVar20 = 1;
      }
      else {
        bVar20 = 1;
        bVar1 = 0;
      }
    }
  }
  bVar26 = bVar26 & 0x3c | bVar19 & 1 | local_f8._0_1_ & 0xc2;
  local_f8._0_1_ = bVar26;
  if (!(bool)(bVar1 & bVar20)) goto LAB_00123e8f;
  __ptr = (MonitoredItem_queuedValue *)malloc(0x78);
  if (__ptr == (MonitoredItem_queuedValue *)0x0) {
    pUVar9 = valueEncoding.data + 0x80;
    lVar22 = *(long *)(cbs.data + 0x10);
    lVar10 = *(long *)(lVar22 + 0xd8);
    if (lVar10 == 0) {
      uVar21 = 0;
      uVar25 = 0;
    }
    else {
      if (*(long *)(lVar10 + 0xc0) == 0) {
        uVar21 = 0;
      }
      else {
        uVar21 = (ulong)*(uint *)(*(long *)(lVar10 + 0xc0) + 0x38);
      }
      uVar25 = (ulong)*(uint *)(lVar10 + 8);
    }
    valueEncoding.data = (UA_Byte *)(ulong)*(ushort *)(lVar22 + 0xb4);
    UA_LOG_WARNING(*(UA_Logger *)pUVar9,UA_LOGCATEGORY_SESSION,
                   "Connection %i | SecureChannel %i | Session %08x-%04x-%04x-%02x%02x-%02x%02x%02x%02x%02x%02x | Subscription %u | MonitoredItem %i | Item for the publishing queue could not be allocated"
                   ,uVar21,uVar25,(ulong)*(uint *)(lVar22 + 0xb0),valueEncoding.data,
                   (ulong)*(ushort *)(lVar22 + 0xb6),(ulong)*(byte *)(lVar22 + 0xb8),
                   (ulong)*(byte *)(lVar22 + 0xb9),(ulong)*(byte *)(lVar22 + 0xba),
                   (ulong)*(byte *)(lVar22 + 0xbb),(ulong)*(byte *)(lVar22 + 0xbc),
                   (ulong)*(byte *)(lVar22 + 0xbd),(ulong)*(byte *)(lVar22 + 0xbe),
                   (ulong)*(byte *)(lVar22 + 0xbf),(ulong)*(uint *)(cbs.data + 0x28),
                   (ulong)monitoredItem->itemId);
    goto LAB_00123e8f;
  }
  if ((undefined1 *)valueEncoding.length == auStack_348) {
    UVar15 = UA_copy(auStack_48,&sStack_90,UA_TYPES + 0xe);
    if (UVar15 == 0) {
      auStack_48 = (undefined1  [8])sStack_90;
      valueEncoding.length = cbs.length;
      bVar26 = local_f8._0_1_;
      goto LAB_00123a91;
    }
    logger = *(UA_Logger *)(valueEncoding.data + 0x80);
    lVar22 = *(long *)(cbs.data + 0x10);
    lVar10 = *(long *)(lVar22 + 0xd8);
    if (lVar10 == 0) {
      uVar21 = 0;
      uVar25 = 0;
    }
    else {
      if (*(long *)(lVar10 + 0xc0) == 0) {
        uVar21 = 0;
      }
      else {
        uVar21 = (ulong)*(uint *)(*(long *)(lVar10 + 0xc0) + 0x38);
      }
      uVar25 = (ulong)*(uint *)(lVar10 + 8);
    }
    uVar17 = *(uint *)(lVar22 + 0xb0);
    uVar5 = *(ushort *)(lVar22 + 0xb4);
    uVar6 = *(ushort *)(lVar22 + 0xb6);
    bVar27 = *(byte *)(lVar22 + 0xb8);
    bVar26 = *(byte *)(lVar22 + 0xb9);
    bVar19 = *(byte *)(lVar22 + 0xba);
    bVar20 = *(byte *)(lVar22 + 0xbb);
    bVar1 = *(byte *)(lVar22 + 0xbc);
    bVar2 = *(byte *)(lVar22 + 0xbd);
    bVar3 = *(byte *)(lVar22 + 0xbe);
    bVar4 = *(byte *)(lVar22 + 0xbf);
    uVar7 = *(uint *)(cbs.data + 0x28);
    uVar8 = monitoredItem->itemId;
    msg = 
    "Connection %i | SecureChannel %i | Session %08x-%04x-%04x-%02x%02x-%02x%02x%02x%02x%02x%02x | Subscription %u | MonitoredItem %i | ByteString to compare values could not be created"
    ;
  }
  else {
LAB_00123a91:
    if (((bVar26 & 1) == 0) || (local_f8.value.storageType != UA_VARIANT_DATA_NODELETE)) {
      pUVar23 = &local_f8;
      pUVar24 = &__ptr->value;
      for (lVar22 = 0xc; lVar22 != 0; lVar22 = lVar22 + -1) {
        *(undefined8 *)pUVar24 = *(undefined8 *)pUVar23;
        pUVar23 = (UA_DataValue *)((long)pUVar23 + ((ulong)bVar27 * -2 + 1) * 8);
        pUVar24 = (UA_DataValue *)((long)pUVar24 + (ulong)bVar27 * -0x10 + 8);
      }
LAB_00123b52:
      __ptr->clientHandle = monitoredItem->clientHandle;
      deleteMembers_noInit(&monitoredItem->lastSampledValue,UA_TYPES + 0xe);
      (monitoredItem->lastSampledValue).length = (size_t)auStack_48;
      (monitoredItem->lastSampledValue).data = (UA_Byte *)valueEncoding.length;
      uVar17 = monitoredItem->currentQueueSize;
      if (monitoredItem->maxQueueSize <= uVar17) {
        if (monitoredItem->discardOldest == true) {
          pMVar18 = (MonitoredItem_queuedValue *)&monitoredItem->queue;
        }
        else {
          pMVar18 = (monitoredItem->queue).tqh_last[1];
        }
        pMVar18 = (pMVar18->listEntry).tqe_next;
        if (pMVar18 == (MonitoredItem_queuedValue *)0x0) {
          __assert_fail("queueItem",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jh-isw[P]OpcUaConsoleClient/open62541/open62541.c"
                        ,0x5cc2,"void ensureSpaceInMonitoredItemQueue(UA_MonitoredItem *)");
        }
        pMVar11 = (pMVar18->listEntry).tqe_next;
        paVar13 = &pMVar11->listEntry;
        if (pMVar11 == (MonitoredItem_queuedValue *)0x0) {
          paVar13 = (anon_struct_16_2_4dd83919_for_listEntry *)&monitoredItem->queue;
        }
        ppMVar12 = (pMVar18->listEntry).tqe_prev;
        paVar13->tqe_prev = ppMVar12;
        *ppMVar12 = pMVar11;
        deleteMembers_noInit(&pMVar18->value,UA_TYPES + 0x16);
        free(pMVar18);
        uVar17 = monitoredItem->currentQueueSize - 1;
      }
      (__ptr->listEntry).tqe_next = (MonitoredItem_queuedValue *)0x0;
      ppMVar12 = (monitoredItem->queue).tqh_last;
      (__ptr->listEntry).tqe_prev = ppMVar12;
      *ppMVar12 = __ptr;
      (monitoredItem->queue).tqh_last = (MonitoredItem_queuedValue **)__ptr;
      monitoredItem->currentQueueSize = uVar17 + 1;
      return;
    }
    UVar15 = UA_copy(&local_f8,&__ptr->value,UA_TYPES + 0x16);
    if (UVar15 == 0) goto LAB_00123b52;
    logger = *(UA_Logger *)(valueEncoding.data + 0x80);
    lVar22 = *(long *)(cbs.data + 0x10);
    lVar10 = *(long *)(lVar22 + 0xd8);
    if (lVar10 == 0) {
      uVar21 = 0;
      uVar25 = 0;
    }
    else {
      if (*(long *)(lVar10 + 0xc0) == 0) {
        uVar21 = 0;
      }
      else {
        uVar21 = (ulong)*(uint *)(*(long *)(lVar10 + 0xc0) + 0x38);
      }
      uVar25 = (ulong)*(uint *)(lVar10 + 8);
    }
    uVar17 = *(uint *)(lVar22 + 0xb0);
    uVar5 = *(ushort *)(lVar22 + 0xb4);
    uVar6 = *(ushort *)(lVar22 + 0xb6);
    bVar27 = *(byte *)(lVar22 + 0xb8);
    bVar26 = *(byte *)(lVar22 + 0xb9);
    bVar19 = *(byte *)(lVar22 + 0xba);
    bVar20 = *(byte *)(lVar22 + 0xbb);
    bVar1 = *(byte *)(lVar22 + 0xbc);
    bVar2 = *(byte *)(lVar22 + 0xbd);
    bVar3 = *(byte *)(lVar22 + 0xbe);
    bVar4 = *(byte *)(lVar22 + 0xbf);
    uVar7 = *(uint *)(cbs.data + 0x28);
    uVar8 = monitoredItem->itemId;
    msg = 
    "Connection %i | SecureChannel %i | Session %08x-%04x-%04x-%02x%02x-%02x%02x%02x%02x%02x%02x | Subscription %u | MonitoredItem %i | Item for the publishing queue could not be prepared"
    ;
  }
  valueEncoding.data = (UA_Byte *)(ulong)uVar5;
  local_50 = (ulong)bVar20;
  local_58 = (ulong)bVar19;
  local_60 = (ulong)bVar26;
  local_68 = (ulong)bVar27;
  local_70 = (ulong)uVar6;
  local_78 = (ulong)bVar1;
  UA_LOG_WARNING(logger,UA_LOGCATEGORY_SESSION,msg,uVar21,uVar25,(ulong)uVar17,valueEncoding.data,
                 local_70,local_68,local_60,local_58,local_50,local_78,(ulong)bVar2,(ulong)bVar3,
                 (ulong)bVar4,(ulong)uVar7,(ulong)uVar8);
  free(__ptr);
LAB_00123e8f:
  if ((undefined1 *)valueEncoding.length != auStack_348) {
    deleteMembers_noInit(auStack_48,UA_TYPES + 0xe);
    auStack_48 = (undefined1  [8])0x0;
    valueEncoding.length = 0;
  }
  deleteMembers_noInit(&local_f8,UA_TYPES + 0x16);
  return;
}

Assistant:

void UA_MoniteredItem_SampleCallback(UA_Server *server, UA_MonitoredItem *monitoredItem) {
    UA_Subscription *sub = monitoredItem->subscription;
    if(monitoredItem->monitoredItemType != UA_MONITOREDITEMTYPE_CHANGENOTIFY) {
        UA_LOG_DEBUG_SESSION(server->config.logger, sub->session,
                             "Subscription %u | MonitoredItem %i | "
                             "Not a data change notification",
                             sub->subscriptionID, monitoredItem->itemId);
        return;
    }

    /* Read the value */
    UA_ReadValueId rvid;
    UA_ReadValueId_init(&rvid);
    rvid.nodeId = monitoredItem->monitoredNodeId;
    rvid.attributeId = monitoredItem->attributeID;
    rvid.indexRange = monitoredItem->indexRange;
    UA_DataValue value;
    UA_DataValue_init(&value);
    Service_Read_single(server, sub->session, monitoredItem->timestampsToReturn,
                        &rvid, &value);

    /* Stack-allocate some memory for the value encoding */
    UA_Byte *stackValueEncoding = UA_alloca(UA_VALUENCODING_MAXSTACK);
    UA_ByteString valueEncoding;
    valueEncoding.data = stackValueEncoding;
    valueEncoding.length = UA_VALUENCODING_MAXSTACK;

    /* Has the value changed? */
    UA_Boolean changed = false;
    UA_StatusCode retval = detectValueChange(monitoredItem, &value,
                                             &valueEncoding, &changed);
    if(!changed || retval != UA_STATUSCODE_GOOD)
        goto cleanup;

    /* Allocate the entry for the publish queue */
    MonitoredItem_queuedValue *newQueueItem = UA_malloc(sizeof(MonitoredItem_queuedValue));
    if(!newQueueItem) {
        UA_LOG_WARNING_SESSION(server->config.logger, sub->session,
                               "Subscription %u | MonitoredItem %i | "
                               "Item for the publishing queue could not be allocated",
                               sub->subscriptionID, monitoredItem->itemId);
        goto cleanup;
    }

    /* Copy valueEncoding on the heap for the next comparison (if not already done) */
    if(valueEncoding.data == stackValueEncoding) {
        UA_ByteString cbs;
        if(UA_ByteString_copy(&valueEncoding, &cbs) != UA_STATUSCODE_GOOD) {
            UA_LOG_WARNING_SESSION(server->config.logger, sub->session,
                                   "Subscription %u | MonitoredItem %i | "
                                   "ByteString to compare values could not be created",
                                   sub->subscriptionID, monitoredItem->itemId);
            UA_free(newQueueItem);
            goto cleanup;
        }
        valueEncoding = cbs;
    }

    /* Prepare the newQueueItem */
    if(value.hasValue && value.value.storageType == UA_VARIANT_DATA_NODELETE) {
        if(UA_DataValue_copy(&value, &newQueueItem->value) != UA_STATUSCODE_GOOD) {
            UA_LOG_WARNING_SESSION(server->config.logger, sub->session,
                                   "Subscription %u | MonitoredItem %i | "
                                   "Item for the publishing queue could not be prepared",
                                   sub->subscriptionID, monitoredItem->itemId);
            UA_free(newQueueItem);
            goto cleanup;
        }
    } else {
        newQueueItem->value = value;
    }
    newQueueItem->clientHandle = monitoredItem->clientHandle;

    /* <-- Point of no return --> */

    UA_LOG_DEBUG_SESSION(server->config.logger, sub->session,
                         "Subscription %u | MonitoredItem %u | Sampled a new value",
                         sub->subscriptionID, monitoredItem->itemId);

    /* Replace the encoding for comparison */
    UA_ByteString_deleteMembers(&monitoredItem->lastSampledValue);
    monitoredItem->lastSampledValue = valueEncoding;

    /* Add the sample to the queue for publication */
    ensureSpaceInMonitoredItemQueue(monitoredItem);
    TAILQ_INSERT_TAIL(&monitoredItem->queue, newQueueItem, listEntry);
    ++monitoredItem->currentQueueSize;
    return;

 cleanup:
    if(valueEncoding.data != stackValueEncoding)
        UA_ByteString_deleteMembers(&valueEncoding);
    UA_DataValue_deleteMembers(&value);
}